

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O0

bool miniply::double_literal(char *start,char **end,double *val)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  double dVar5;
  double local_60;
  double exponent;
  bool negativeExponent;
  double dStack_50;
  bool hasExponent;
  double scale;
  bool hasFracDigits;
  double dStack_40;
  bool hasIntDigits;
  double localVal;
  char *pcStack_30;
  bool negative;
  char *pos;
  double *val_local;
  char **end_local;
  char *start_local;
  
  bVar1 = false;
  if (*start == '-') {
    bVar1 = true;
    pcStack_30 = start + 1;
  }
  else {
    pcStack_30 = start;
    if (*start == '+') {
      pcStack_30 = start + 1;
    }
  }
  dStack_40 = 0.0;
  bVar2 = is_digit(*pcStack_30);
  if (bVar2) {
    do {
      dStack_40 = dStack_40 * 10.0 + *(double *)(kDoubleDigits + (long)(*pcStack_30 + -0x30) * 8);
      pcStack_30 = pcStack_30 + 1;
      bVar3 = is_digit(*pcStack_30);
    } while (bVar3);
  }
  else if (*pcStack_30 != '.') {
    return false;
  }
  if (*pcStack_30 == '.') {
    pcStack_30 = pcStack_30 + 1;
    bVar3 = is_digit(*pcStack_30);
    if (bVar3) {
      dStack_50 = 0.1;
      do {
        dStack_40 = dStack_50 * *(double *)(kDoubleDigits + (long)(*pcStack_30 + -0x30) * 8) +
                    dStack_40;
        dStack_50 = dStack_50 * 0.1;
        pcStack_30 = pcStack_30 + 1;
        bVar2 = is_digit(*pcStack_30);
      } while (bVar2);
    }
    else if (!bVar2) {
      return false;
    }
  }
  bVar2 = true;
  if (*pcStack_30 != 'e') {
    bVar2 = *pcStack_30 == 'E';
  }
  if (bVar2) {
    pcVar4 = pcStack_30 + 1;
    bVar2 = false;
    if (*pcVar4 == '-') {
      bVar2 = true;
      pcVar4 = pcStack_30 + 2;
    }
    else if (*pcVar4 == '+') {
      pcVar4 = pcStack_30 + 2;
    }
    pcStack_30 = pcVar4;
    bVar3 = is_digit(*pcStack_30);
    if (!bVar3) {
      return false;
    }
    local_60 = 0.0;
    do {
      local_60 = local_60 * 10.0 + *(double *)(kDoubleDigits + (long)(*pcStack_30 + -0x30) * 8);
      pcStack_30 = pcStack_30 + 1;
      bVar3 = is_digit(*pcStack_30);
    } while (bVar3);
    if (val != (double *)0x0) {
      if (bVar2) {
        local_60 = -local_60;
      }
      dVar5 = pow(10.0,local_60);
      dStack_40 = dVar5 * dStack_40;
    }
  }
  if (((*pcStack_30 == '.') || (*pcStack_30 == '_')) || (bVar2 = is_alnum(*pcStack_30), bVar2)) {
    start_local._7_1_ = false;
  }
  else {
    if (bVar1) {
      dStack_40 = -dStack_40;
    }
    if (val != (double *)0x0) {
      *val = dStack_40;
    }
    if (end != (char **)0x0) {
      *end = pcStack_30;
    }
    start_local._7_1_ = true;
  }
  return start_local._7_1_;
}

Assistant:

static bool double_literal(const char* start, char const** end, double* val)
  {
    const char* pos = start;

    bool negative = false;
    if (*pos == '-') {
      negative = true;
      ++pos;
    }
    else if (*pos == '+') {
      ++pos;
    }

    double localVal = 0.0;

    bool hasIntDigits = is_digit(*pos);
    if (hasIntDigits) {
      do {
        localVal = localVal * 10.0 + kDoubleDigits[*pos - '0'];
        ++pos;
      } while (is_digit(*pos));
    }
    else if (*pos != '.') {
//      set_error("Not a floating point number");
      return false;
    }

    bool hasFracDigits = false;
    if (*pos == '.') {
      ++pos;
      hasFracDigits = is_digit(*pos);
      if (hasFracDigits) {
        double scale = 0.1;
        do {
          localVal += scale * kDoubleDigits[*pos - '0'];
          scale *= 0.1;
          ++pos;
        } while (is_digit(*pos));
      }
      else if (!hasIntDigits) {
//        set_error("Floating point number has no digits before or after the decimal point");
        return false;
      }
    }

    bool hasExponent = *pos == 'e' || *pos == 'E';
    if (hasExponent) {
      ++pos;
      bool negativeExponent = false;
      if (*pos == '-') {
        negativeExponent = true;
        ++pos;
      }
      else if (*pos == '+') {
        ++pos;
      }

      if (!is_digit(*pos)) {
//        set_error("Floating point exponent has no digits");
        return false; // error: exponent part has no digits.
      }

      double exponent = 0.0;
      do {
        exponent = exponent * 10.0 + kDoubleDigits[*pos - '0'];
        ++pos;
      } while (is_digit(*pos));

      if (val != nullptr) {
        if (negativeExponent) {
          exponent = -exponent;
        }
        localVal *= std::pow(10.0, exponent);
      }
    }

    if (*pos == '.' || *pos == '_' || is_alnum(*pos)) {
//      set_error("Floating point number has trailing chars");
      return false;
    }

    if (negative) {
      localVal = -localVal;
    }

    if (val != nullptr) {
      *val = localVal;
    }
    if (end != nullptr) {
      *end = pos;
    }
    return true;
  }